

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O3

bool r_exec::_Fact::MatchObject(Code *lhs,Code *rhs)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  bVar3 = false;
  iVar5 = (*(lhs->super__Object)._vptr__Object[5])(lhs,0);
  iVar6 = (*(rhs->super__Object)._vptr__Object[5])(rhs,0);
  cVar1 = r_code::Atom::operator!=
                    ((Atom *)CONCAT44(extraout_var,iVar5),(Atom *)CONCAT44(extraout_var_00,iVar6));
  if (cVar1 == '\0') {
    (*(lhs->super__Object)._vptr__Object[5])(lhs);
    sVar4 = r_code::Atom::asOpcode();
    if ((((sVar4 != Opcodes::Ent) && (sVar4 != Opcodes::Ont)) && (sVar4 != Opcodes::Mdl)) &&
       (sVar4 != Opcodes::Cst)) {
      (*(lhs->super__Object)._vptr__Object[5])(lhs);
      bVar2 = r_code::Atom::getAtomCount();
      bVar3 = Match(lhs,0,1,rhs,1,(ushort)bVar2);
      return bVar3;
    }
    bVar3 = lhs == rhs;
  }
  return bVar3;
}

Assistant:

bool _Fact::MatchObject(const Code *lhs, const Code *rhs)
{
    if (lhs->code(0) != rhs->code(0)) {
        return false;
    }

    uint16_t lhs_opcode = lhs->code(0).asOpcode();

    if (lhs_opcode == Opcodes::Ent ||
        lhs_opcode == Opcodes::Ont ||
        lhs_opcode == Opcodes::Mdl ||
        lhs_opcode == Opcodes::Cst) {
        return lhs == rhs;
    }

    return Match(lhs, 0, 1, rhs, 1, lhs->code(0).getAtomCount());
}